

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<const_Catch::IConfig> * __thiscall
Catch::Ptr<const_Catch::IConfig>::operator=
          (Ptr<const_Catch::IConfig> *this,Ptr<const_Catch::IConfig> *other)

{
  Ptr<const_Catch::IConfig> local_20;
  Ptr<const_Catch::IConfig> temp;
  Ptr<const_Catch::IConfig> *other_local;
  Ptr<const_Catch::IConfig> *this_local;
  
  temp.m_p = (IConfig *)other;
  Ptr(&local_20,other);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }